

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  ZSTD_format_e format;
  unsigned_long_long uVar1;
  ZSTD_ErrorCode ZVar2;
  size_t sVar3;
  size_t srcSize_00;
  size_t __n;
  XXH64_hash_t XVar4;
  ulong uVar5;
  uint *src_00;
  void *dst_00;
  undefined8 uVar6;
  void *dst_01;
  bool bVar7;
  size_t sStack_a0;
  size_t local_70;
  blockProperties_t local_5c;
  byte *local_50;
  void *local_48;
  size_t local_40;
  undefined8 local_38;
  
  local_40 = dictSize;
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ZSTD_DDict_dictContent(ddict);
    local_40 = ZSTD_DDict_dictSize(ddict);
  }
  uVar6 = 0;
  dst_00 = dst;
  local_70 = dstCapacity;
  do {
    while( true ) {
      if (srcSize < (ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1) {
        if (srcSize != 0) {
          return 0xffffffffffffffb8;
        }
        return (long)dst_00 - (long)dst;
      }
      if ((*src & 0xfffffff0) != 0x184d2a50) break;
      if (srcSize < 8) {
        return 0xffffffffffffffb8;
      }
      if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
        return 0xfffffffffffffff2;
      }
      uVar5 = (ulong)*(uint *)((long)src + 4) + 8;
      bVar7 = srcSize < uVar5;
      srcSize = srcSize - uVar5;
      if (bVar7) {
        return 0xffffffffffffffb8;
      }
      src = (void *)((long)src + uVar5);
    }
    local_38 = uVar6;
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar3 = ZSTD_decompressBegin_usingDict(dctx,dict,local_40);
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    local_48 = dict;
    ZSTD_checkContinuity(dctx,dst_00,local_70);
    format = dctx->format;
    sStack_a0 = 0xffffffffffffffb8;
    if (((((ulong)(format == ZSTD_f_zstd1) * 4 + 5 <= srcSize) &&
         (sVar3 = ZSTD_frameHeaderSize_internal(src,(ulong)(format == ZSTD_f_zstd1) * 4 + 1,format),
         sStack_a0 = sVar3, sVar3 < 0xffffffffffffff89)) &&
        (sStack_a0 = 0xffffffffffffffb8, sVar3 + 3 <= srcSize)) &&
       (sStack_a0 = ZSTD_decodeFrameHeader(dctx,src,sVar3), sStack_a0 < 0xffffffffffffff89)) {
      src_00 = (uint *)(sVar3 + (long)src);
      sVar3 = srcSize - sVar3;
      dst_01 = dst_00;
      do {
        srcSize_00 = ZSTD_getcBlockSize(src_00,sVar3,&local_5c);
        sStack_a0 = srcSize_00;
        if (0xffffffffffffff88 < srcSize_00) goto LAB_001fefc2;
        uVar5 = sVar3 - 3;
        sVar3 = uVar5 - srcSize_00;
        if (uVar5 < srcSize_00) {
          sStack_a0 = 0xffffffffffffffb8;
          goto LAB_001fefc2;
        }
        local_50 = (byte *)((long)src_00 + 3);
        if (local_5c.blockType == bt_compressed) {
          __n = ZSTD_decompressBlock_internal
                          (dctx,dst_01,(long)dst_00 + (local_70 - (long)dst_01),local_50,srcSize_00,
                           1);
          sStack_a0 = __n;
          if (0xffffffffffffff88 < __n) goto LAB_001fefc2;
        }
        else if (local_5c.blockType == bt_rle) {
          __n = (size_t)local_5c.origSize;
          sStack_a0 = 0xffffffffffffffba;
          if ((long)dst_00 + (local_70 - (long)dst_01) < __n) goto LAB_001fefc2;
          if (dst_01 == (void *)0x0) goto joined_r0x001fef20;
          memset(dst_01,(uint)*local_50,__n);
        }
        else {
          sStack_a0 = 0xffffffffffffffec;
          if ((local_5c.blockType != bt_raw) ||
             (sStack_a0 = 0xffffffffffffffba, (long)dst_00 + (local_70 - (long)dst_01) < srcSize_00)
             ) goto LAB_001fefc2;
          __n = srcSize_00;
          if (dst_01 == (void *)0x0) {
joined_r0x001fef20:
            if (__n != 0) {
              sStack_a0 = 0xffffffffffffffb6;
              goto LAB_001fefc2;
            }
            __n = 0;
          }
          else {
            memcpy(dst_01,local_50,srcSize_00);
          }
        }
        if (dctx->validateChecksum != 0) {
          XXH64_update(&dctx->xxhState,dst_01,__n);
        }
        dst_01 = (void *)((long)dst_01 + __n);
        src_00 = (uint *)(local_50 + srcSize_00);
      } while (local_5c.lastBlock == 0);
      uVar1 = (dctx->fParams).frameContentSize;
      sStack_a0 = (long)dst_01 - (long)dst_00;
      if ((uVar1 == 0xffffffffffffffff) || (sStack_a0 == uVar1)) {
        if ((dctx->fParams).checksumFlag != 0) {
          if ((sVar3 < 4) ||
             ((dctx->forceIgnoreChecksum == ZSTD_d_validateChecksum &&
              (XVar4 = XXH64_digest(&dctx->xxhState), *src_00 != (uint)XVar4)))) {
            sStack_a0 = 0xffffffffffffffea;
            goto LAB_001fefc2;
          }
          src_00 = src_00 + 1;
          sVar3 = sVar3 - 4;
        }
        ZSTD_DCtx_trace_end(dctx,sStack_a0,(long)src_00 - (long)src,0);
        src = src_00;
        srcSize = sVar3;
      }
      else {
        sStack_a0 = 0xffffffffffffffec;
      }
    }
LAB_001fefc2:
    ZVar2 = ZSTD_getErrorCode(sStack_a0);
    if (((byte)local_38 & ZVar2 == ZSTD_error_prefix_unknown) != 0) {
      return 0xffffffffffffffb8;
    }
    if (0xffffffffffffff88 < sStack_a0) {
      return sStack_a0;
    }
    dst_00 = (void *)((long)dst_00 + sStack_a0);
    local_70 = local_70 - sStack_a0;
    uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
    dict = local_48;
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "readSkippableFrameSize failed");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}